

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O0

void __thiscall cmDocumentation::SetSection(cmDocumentation *this,char *name,char *(*docs) [2])

{
  char *(*name_00) [2];
  cmDocumentationSection *this_00;
  char *pcVar1;
  allocator local_69;
  string local_68;
  string local_48;
  cmDocumentationSection *local_28;
  cmDocumentationSection *sec;
  char *(*docs_local) [2];
  char *name_local;
  cmDocumentation *this_local;
  
  sec = (cmDocumentationSection *)docs;
  docs_local = (char *(*) [2])name;
  name_local = &this->ShowGenerators;
  this_00 = (cmDocumentationSection *)operator_new(0x38);
  name_00 = docs_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,(char *)name_00,&local_69);
  cmsys::SystemTools::UpperCase(&local_48,&local_68);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  cmDocumentationSection::cmDocumentationSection(this_00,(char *)name_00,pcVar1);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  local_28 = this_00;
  cmDocumentationSection::Append(this_00,(char *(*) [2])sec);
  SetSection(this,(char *)docs_local,local_28);
  return;
}

Assistant:

void cmDocumentation::SetSection(const char* name, const char* docs[][2])
{
  cmDocumentationSection* sec =
    new cmDocumentationSection(name, cmSystemTools::UpperCase(name).c_str());
  sec->Append(docs);
  this->SetSection(name, sec);
}